

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall
fasttext::Dictionary::addWordNgrams
          (Dictionary *this,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *hashes,int32_t n)

{
  ulong uVar1;
  pointer piVar2;
  long lVar3;
  pointer piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long local_58;
  ulong local_50;
  
  piVar2 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    local_50 = 2;
    local_58 = 0x200000000;
    uVar5 = 0;
    do {
      uVar1 = uVar5 + 1;
      piVar4 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar1 < (ulong)((long)(hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar4 >> 2) && 1 < n) {
        uVar7 = (ulong)piVar2[uVar5];
        lVar6 = local_58;
        uVar8 = local_50;
        do {
          uVar7 = (long)piVar4[uVar8 - 1] + uVar7 * 0x6eac5db;
          pushHash(this,line,
                   (int32_t)(uVar7 % (ulong)(long)((this->args_).
                                                                                                      
                                                  super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->bucket));
          piVar4 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <= uVar8) break;
          lVar3 = lVar6 >> 0x20;
          uVar8 = uVar8 + 1;
          lVar6 = lVar6 + 0x100000000;
        } while (lVar3 < (long)(uVar5 + (long)n));
      }
      piVar2 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_50 = local_50 + 1;
      local_58 = local_58 + 0x100000000;
      uVar5 = uVar1;
    } while (uVar1 < (ulong)((long)(hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  return;
}

Assistant:

void Dictionary::addWordNgrams(std::vector<int32_t>& line,
                               const std::vector<int32_t>& hashes,
                               int32_t n) const {
  for (int32_t i = 0; i < hashes.size(); i++) {
    uint64_t h = hashes[i];
    for (int32_t j = i + 1; j < hashes.size() && j < i + n; j++) {
      h = h * 116049371 + hashes[j];
      pushHash(line, h % args_->bucket);
    }
  }
}